

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O0

int CVodeGetNumStabLimOrderReds(void *cvode_mem,long *nslred)

{
  undefined8 *in_RSI;
  long in_RDI;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x4c0,"CVodeGetNumStabLimOrderReds",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_io.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    if (*(int *)(in_RDI + 0x488) == 0) {
      *in_RSI = 0;
    }
    else {
      *in_RSI = *(undefined8 *)(in_RDI + 0x558);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeGetNumStabLimOrderReds(void* cvode_mem, long int* nslred)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_sldeton == SUNFALSE) { *nslred = 0; }
  else { *nslred = cv_mem->cv_nor; }

  return (CV_SUCCESS);
}